

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_HealThing(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int local_34;
  int max;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (it != (AActor *)0x0) {
    if ((arg1 == 0) || (it->player == (player_t *)0x0)) {
      P_GiveBody(it,arg0,0);
      return 1;
    }
    local_34 = arg1;
    if (arg1 == 1) {
      local_34 = deh.MaxSoulsphere;
    }
    if (it->health < local_34) {
      it->health = arg0 + it->health;
      if ((local_34 < it->health) && (0 < local_34)) {
        it->health = local_34;
      }
      if (it->player != (player_t *)0x0) {
        it->player->health = it->health;
      }
    }
  }
  return (uint)(-(it != (AActor *)0x0) & 1);
}

Assistant:

FUNC(LS_HealThing)
// HealThing (amount, max)
{
	if (it)
	{
		int max = arg1;

		if (max == 0 || it->player == NULL)
		{
			P_GiveBody(it, arg0);
			return true;
		}
		else if (max == 1)
		{
			max = deh.MaxSoulsphere;
		}

		// If health is already above max, do nothing
		if (it->health < max)
		{
			it->health += arg0;
			if (it->health > max && max > 0)
			{
				it->health = max;
			}
			if (it->player)
			{
				it->player->health = it->health;
			}
		}
	}

	return it ? true : false;
}